

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O2

void __thiscall CProfileNode::Call(CProfileNode *this)

{
  int iVar1;
  
  this->TotalCalls = this->TotalCalls + 1;
  iVar1 = this->RecursionCounter;
  this->RecursionCounter = iVar1 + 1;
  if (iVar1 != 0) {
    return;
  }
  Profile_Get_Ticks(&this->StartTime);
  return;
}

Assistant:

void	CProfileNode::Call( void )
{
	TotalCalls++;
	if (RecursionCounter++ == 0) {
		Profile_Get_Ticks(&StartTime);
	}
}